

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Text __thiscall loguru::ec_to_text(loguru *this,EcHandle ec_handle)

{
  char *pcVar1;
  size_t sVar2;
  char *__src;
  char *with_newline;
  Text parent_ec;
  EcHandle ec_handle_local;
  
  parent_ec._str = (char *)ec_handle;
  get_error_context_for((loguru *)&with_newline,ec_handle);
  pcVar1 = Text::c_str((Text *)&with_newline);
  sVar2 = strlen(pcVar1);
  pcVar1 = (char *)malloc(sVar2 + 2);
  *pcVar1 = '\n';
  __src = Text::c_str((Text *)&with_newline);
  strcpy(pcVar1 + 1,__src);
  Text::Text((Text *)this,pcVar1);
  Text::~Text((Text *)&with_newline);
  return (Text)(char *)this;
}

Assistant:

Text ec_to_text(EcHandle ec_handle)
	{
		Text parent_ec = get_error_context_for(ec_handle);
		char* with_newline = reinterpret_cast<char*>(malloc(strlen(parent_ec.c_str()) + 2));
		with_newline[0] = '\n';
		strcpy(with_newline + 1, parent_ec.c_str());
		return Text(with_newline);
	}